

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeoutMonitor.cpp
# Opt level: O3

void __thiscall helics::TimeoutMonitor::reset(TimeoutMonitor *this)

{
  pointer plVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  pointer plVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar54;
  int iVar57;
  int iVar58;
  undefined1 auVar55 [16];
  int iVar59;
  undefined1 auVar56 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  int iVar73;
  int iVar77;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  
  (this->parentConnection).waitingForPingReply = false;
  this->waitingForConnection = false;
  auVar30 = _DAT_00447d00;
  auVar29 = _DAT_00447cf0;
  auVar28 = _DAT_00418670;
  auVar27 = _DAT_00418660;
  auVar26 = _DAT_00418650;
  auVar25 = _DAT_00418640;
  auVar24 = _DAT_00418630;
  plVar31 = (this->connections).
            super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>.
            _M_impl.super__Vector_impl_data._M_start;
  plVar1 = (this->connections).
           super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (plVar31 != plVar1) {
    uVar32 = (long)plVar1 + (-0x10 - (long)plVar31);
    auVar55._8_4_ = (int)uVar32;
    auVar55._0_8_ = uVar32;
    auVar55._12_4_ = (int)(uVar32 >> 0x20);
    auVar34._0_8_ = uVar32 >> 4;
    auVar34._8_8_ = auVar55._8_8_ >> 4;
    plVar31 = plVar31 + 0xf;
    uVar33 = 0;
    do {
      auVar52._8_4_ = (int)uVar33;
      auVar52._0_8_ = uVar33;
      auVar52._12_4_ = (int)(uVar33 >> 0x20);
      auVar55 = auVar34 ^ auVar28;
      auVar60 = (auVar52 | auVar27) ^ auVar28;
      iVar54 = auVar55._0_4_;
      iVar73 = -(uint)(iVar54 < auVar60._0_4_);
      iVar57 = auVar55._4_4_;
      auVar62._4_4_ = -(uint)(iVar57 < auVar60._4_4_);
      iVar58 = auVar55._8_4_;
      iVar77 = -(uint)(iVar58 < auVar60._8_4_);
      iVar59 = auVar55._12_4_;
      auVar62._12_4_ = -(uint)(iVar59 < auVar60._12_4_);
      auVar35._4_4_ = iVar73;
      auVar35._0_4_ = iVar73;
      auVar35._8_4_ = iVar77;
      auVar35._12_4_ = iVar77;
      auVar55 = pshuflw(in_XMM1,auVar35,0xe8);
      auVar61._4_4_ = -(uint)(auVar60._4_4_ == iVar57);
      auVar61._12_4_ = -(uint)(auVar60._12_4_ == iVar59);
      auVar61._0_4_ = auVar61._4_4_;
      auVar61._8_4_ = auVar61._12_4_;
      auVar44 = pshuflw(in_XMM2,auVar61,0xe8);
      auVar62._0_4_ = auVar62._4_4_;
      auVar62._8_4_ = auVar62._12_4_;
      auVar35 = pshuflw(auVar55,auVar62,0xe8);
      auVar60._8_4_ = 0xffffffff;
      auVar60._0_8_ = 0xffffffffffffffff;
      auVar60._12_4_ = 0xffffffff;
      auVar60 = (auVar35 | auVar44 & auVar55) ^ auVar60;
      auVar55 = packssdw(auVar60,auVar60);
      if ((auVar55 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        plVar31[-0xf].waitingForPingReply = false;
      }
      auVar11._4_4_ = iVar73;
      auVar11._0_4_ = iVar73;
      auVar11._8_4_ = iVar77;
      auVar11._12_4_ = iVar77;
      auVar62 = auVar61 & auVar11 | auVar62;
      auVar55 = packssdw(auVar62,auVar62);
      auVar44._8_4_ = 0xffffffff;
      auVar44._0_8_ = 0xffffffffffffffff;
      auVar44._12_4_ = 0xffffffff;
      auVar55 = packssdw(auVar55 ^ auVar44,auVar55 ^ auVar44);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55._0_4_ >> 8 & 1) != 0) {
        plVar31[-0xe].waitingForPingReply = false;
      }
      auVar55 = (auVar52 | auVar26) ^ auVar28;
      auVar45._0_4_ = -(uint)(iVar54 < auVar55._0_4_);
      auVar45._4_4_ = -(uint)(iVar57 < auVar55._4_4_);
      auVar45._8_4_ = -(uint)(iVar58 < auVar55._8_4_);
      auVar45._12_4_ = -(uint)(iVar59 < auVar55._12_4_);
      auVar63._4_4_ = auVar45._0_4_;
      auVar63._0_4_ = auVar45._0_4_;
      auVar63._8_4_ = auVar45._8_4_;
      auVar63._12_4_ = auVar45._8_4_;
      iVar73 = -(uint)(auVar55._4_4_ == iVar57);
      iVar77 = -(uint)(auVar55._12_4_ == iVar59);
      auVar12._4_4_ = iVar73;
      auVar12._0_4_ = iVar73;
      auVar12._8_4_ = iVar77;
      auVar12._12_4_ = iVar77;
      auVar74._4_4_ = auVar45._4_4_;
      auVar74._0_4_ = auVar45._4_4_;
      auVar74._8_4_ = auVar45._12_4_;
      auVar74._12_4_ = auVar45._12_4_;
      auVar55 = auVar12 & auVar63 | auVar74;
      auVar55 = packssdw(auVar55,auVar55);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar55 = packssdw(auVar55 ^ auVar2,auVar55 ^ auVar2);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55._0_4_ >> 0x10 & 1) != 0) {
        plVar31[-0xd].waitingForPingReply = false;
      }
      auVar55 = pshufhw(auVar55,auVar63,0x84);
      auVar13._4_4_ = iVar73;
      auVar13._0_4_ = iVar73;
      auVar13._8_4_ = iVar77;
      auVar13._12_4_ = iVar77;
      auVar35 = pshufhw(auVar45,auVar13,0x84);
      auVar60 = pshufhw(auVar55,auVar74,0x84);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar36 = (auVar60 | auVar35 & auVar55) ^ auVar36;
      auVar55 = packssdw(auVar36,auVar36);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55._0_4_ >> 0x18 & 1) != 0) {
        plVar31[-0xc].waitingForPingReply = false;
      }
      auVar55 = (auVar52 | auVar25) ^ auVar28;
      auVar46._0_4_ = -(uint)(iVar54 < auVar55._0_4_);
      auVar46._4_4_ = -(uint)(iVar57 < auVar55._4_4_);
      auVar46._8_4_ = -(uint)(iVar58 < auVar55._8_4_);
      auVar46._12_4_ = -(uint)(iVar59 < auVar55._12_4_);
      auVar14._4_4_ = auVar46._0_4_;
      auVar14._0_4_ = auVar46._0_4_;
      auVar14._8_4_ = auVar46._8_4_;
      auVar14._12_4_ = auVar46._8_4_;
      auVar35 = pshuflw(auVar74,auVar14,0xe8);
      auVar37._0_4_ = -(uint)(auVar55._0_4_ == iVar54);
      auVar37._4_4_ = -(uint)(auVar55._4_4_ == iVar57);
      auVar37._8_4_ = -(uint)(auVar55._8_4_ == iVar58);
      auVar37._12_4_ = -(uint)(auVar55._12_4_ == iVar59);
      auVar64._4_4_ = auVar37._4_4_;
      auVar64._0_4_ = auVar37._4_4_;
      auVar64._8_4_ = auVar37._12_4_;
      auVar64._12_4_ = auVar37._12_4_;
      auVar55 = pshuflw(auVar37,auVar64,0xe8);
      auVar65._4_4_ = auVar46._4_4_;
      auVar65._0_4_ = auVar46._4_4_;
      auVar65._8_4_ = auVar46._12_4_;
      auVar65._12_4_ = auVar46._12_4_;
      auVar60 = pshuflw(auVar46,auVar65,0xe8);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar55 = packssdw(auVar55 & auVar35,(auVar60 | auVar55 & auVar35) ^ auVar3);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        plVar31[-0xb].waitingForPingReply = false;
      }
      auVar15._4_4_ = auVar46._0_4_;
      auVar15._0_4_ = auVar46._0_4_;
      auVar15._8_4_ = auVar46._8_4_;
      auVar15._12_4_ = auVar46._8_4_;
      auVar65 = auVar64 & auVar15 | auVar65;
      auVar60 = packssdw(auVar65,auVar65);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar55 = packssdw(auVar55,auVar60 ^ auVar4);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55._4_2_ >> 8 & 1) != 0) {
        plVar31[-10].waitingForPingReply = false;
      }
      auVar55 = (auVar52 | auVar24) ^ auVar28;
      auVar47._0_4_ = -(uint)(iVar54 < auVar55._0_4_);
      auVar47._4_4_ = -(uint)(iVar57 < auVar55._4_4_);
      auVar47._8_4_ = -(uint)(iVar58 < auVar55._8_4_);
      auVar47._12_4_ = -(uint)(iVar59 < auVar55._12_4_);
      auVar66._4_4_ = auVar47._0_4_;
      auVar66._0_4_ = auVar47._0_4_;
      auVar66._8_4_ = auVar47._8_4_;
      auVar66._12_4_ = auVar47._8_4_;
      iVar73 = -(uint)(auVar55._4_4_ == iVar57);
      iVar77 = -(uint)(auVar55._12_4_ == iVar59);
      auVar16._4_4_ = iVar73;
      auVar16._0_4_ = iVar73;
      auVar16._8_4_ = iVar77;
      auVar16._12_4_ = iVar77;
      auVar75._4_4_ = auVar47._4_4_;
      auVar75._0_4_ = auVar47._4_4_;
      auVar75._8_4_ = auVar47._12_4_;
      auVar75._12_4_ = auVar47._12_4_;
      auVar55 = auVar16 & auVar66 | auVar75;
      auVar55 = packssdw(auVar55,auVar55);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar55 = packssdw(auVar55 ^ auVar5,auVar55 ^ auVar5);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        plVar31[-9].waitingForPingReply = false;
      }
      auVar55 = pshufhw(auVar55,auVar66,0x84);
      auVar17._4_4_ = iVar73;
      auVar17._0_4_ = iVar73;
      auVar17._8_4_ = iVar77;
      auVar17._12_4_ = iVar77;
      auVar35 = pshufhw(auVar47,auVar17,0x84);
      auVar60 = pshufhw(auVar55,auVar75,0x84);
      auVar38._8_4_ = 0xffffffff;
      auVar38._0_8_ = 0xffffffffffffffff;
      auVar38._12_4_ = 0xffffffff;
      auVar38 = (auVar60 | auVar35 & auVar55) ^ auVar38;
      auVar55 = packssdw(auVar38,auVar38);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55._6_2_ >> 8 & 1) != 0) {
        plVar31[-8].waitingForPingReply = false;
      }
      auVar55 = (auVar52 | auVar30) ^ auVar28;
      auVar48._0_4_ = -(uint)(iVar54 < auVar55._0_4_);
      auVar48._4_4_ = -(uint)(iVar57 < auVar55._4_4_);
      auVar48._8_4_ = -(uint)(iVar58 < auVar55._8_4_);
      auVar48._12_4_ = -(uint)(iVar59 < auVar55._12_4_);
      auVar18._4_4_ = auVar48._0_4_;
      auVar18._0_4_ = auVar48._0_4_;
      auVar18._8_4_ = auVar48._8_4_;
      auVar18._12_4_ = auVar48._8_4_;
      auVar35 = pshuflw(auVar75,auVar18,0xe8);
      auVar39._0_4_ = -(uint)(auVar55._0_4_ == iVar54);
      auVar39._4_4_ = -(uint)(auVar55._4_4_ == iVar57);
      auVar39._8_4_ = -(uint)(auVar55._8_4_ == iVar58);
      auVar39._12_4_ = -(uint)(auVar55._12_4_ == iVar59);
      auVar67._4_4_ = auVar39._4_4_;
      auVar67._0_4_ = auVar39._4_4_;
      auVar67._8_4_ = auVar39._12_4_;
      auVar67._12_4_ = auVar39._12_4_;
      auVar55 = pshuflw(auVar39,auVar67,0xe8);
      auVar68._4_4_ = auVar48._4_4_;
      auVar68._0_4_ = auVar48._4_4_;
      auVar68._8_4_ = auVar48._12_4_;
      auVar68._12_4_ = auVar48._12_4_;
      auVar60 = pshuflw(auVar48,auVar68,0xe8);
      auVar49._8_4_ = 0xffffffff;
      auVar49._0_8_ = 0xffffffffffffffff;
      auVar49._12_4_ = 0xffffffff;
      auVar49 = (auVar60 | auVar55 & auVar35) ^ auVar49;
      auVar60 = packssdw(auVar49,auVar49);
      auVar55 = packsswb(auVar55 & auVar35,auVar60);
      if ((auVar55 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        plVar31[-7].waitingForPingReply = false;
      }
      auVar19._4_4_ = auVar48._0_4_;
      auVar19._0_4_ = auVar48._0_4_;
      auVar19._8_4_ = auVar48._8_4_;
      auVar19._12_4_ = auVar48._8_4_;
      auVar68 = auVar67 & auVar19 | auVar68;
      auVar60 = packssdw(auVar68,auVar68);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar6,auVar60 ^ auVar6);
      auVar55 = packsswb(auVar55,auVar60);
      if ((auVar55._8_2_ >> 8 & 1) != 0) {
        plVar31[-6].waitingForPingReply = false;
      }
      auVar55 = (auVar52 | auVar29) ^ auVar28;
      auVar50._0_4_ = -(uint)(iVar54 < auVar55._0_4_);
      auVar50._4_4_ = -(uint)(iVar57 < auVar55._4_4_);
      auVar50._8_4_ = -(uint)(iVar58 < auVar55._8_4_);
      auVar50._12_4_ = -(uint)(iVar59 < auVar55._12_4_);
      auVar69._4_4_ = auVar50._0_4_;
      auVar69._0_4_ = auVar50._0_4_;
      auVar69._8_4_ = auVar50._8_4_;
      auVar69._12_4_ = auVar50._8_4_;
      iVar73 = -(uint)(auVar55._4_4_ == iVar57);
      iVar77 = -(uint)(auVar55._12_4_ == iVar59);
      auVar20._4_4_ = iVar73;
      auVar20._0_4_ = iVar73;
      auVar20._8_4_ = iVar77;
      auVar20._12_4_ = iVar77;
      auVar76._4_4_ = auVar50._4_4_;
      auVar76._0_4_ = auVar50._4_4_;
      auVar76._8_4_ = auVar50._12_4_;
      auVar76._12_4_ = auVar50._12_4_;
      auVar55 = auVar20 & auVar69 | auVar76;
      auVar55 = packssdw(auVar55,auVar55);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar55 = packssdw(auVar55 ^ auVar7,auVar55 ^ auVar7);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        plVar31[-5].waitingForPingReply = false;
      }
      auVar55 = pshufhw(auVar55,auVar69,0x84);
      auVar21._4_4_ = iVar73;
      auVar21._0_4_ = iVar73;
      auVar21._8_4_ = iVar77;
      auVar21._12_4_ = iVar77;
      auVar35 = pshufhw(auVar50,auVar21,0x84);
      auVar60 = pshufhw(auVar55,auVar76,0x84);
      auVar40._8_4_ = 0xffffffff;
      auVar40._0_8_ = 0xffffffffffffffff;
      auVar40._12_4_ = 0xffffffff;
      auVar40 = (auVar60 | auVar35 & auVar55) ^ auVar40;
      auVar55 = packssdw(auVar40,auVar40);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55._10_2_ >> 8 & 1) != 0) {
        plVar31[-4].waitingForPingReply = false;
      }
      auVar55 = (auVar52 | _DAT_00447ce0) ^ auVar28;
      auVar51._0_4_ = -(uint)(iVar54 < auVar55._0_4_);
      auVar51._4_4_ = -(uint)(iVar57 < auVar55._4_4_);
      auVar51._8_4_ = -(uint)(iVar58 < auVar55._8_4_);
      auVar51._12_4_ = -(uint)(iVar59 < auVar55._12_4_);
      auVar22._4_4_ = auVar51._0_4_;
      auVar22._0_4_ = auVar51._0_4_;
      auVar22._8_4_ = auVar51._8_4_;
      auVar22._12_4_ = auVar51._8_4_;
      auVar35 = pshuflw(auVar76,auVar22,0xe8);
      auVar41._0_4_ = -(uint)(auVar55._0_4_ == iVar54);
      auVar41._4_4_ = -(uint)(auVar55._4_4_ == iVar57);
      auVar41._8_4_ = -(uint)(auVar55._8_4_ == iVar58);
      auVar41._12_4_ = -(uint)(auVar55._12_4_ == iVar59);
      auVar70._4_4_ = auVar41._4_4_;
      auVar70._0_4_ = auVar41._4_4_;
      auVar70._8_4_ = auVar41._12_4_;
      auVar70._12_4_ = auVar41._12_4_;
      auVar55 = pshuflw(auVar41,auVar70,0xe8);
      auVar71._4_4_ = auVar51._4_4_;
      auVar71._0_4_ = auVar51._4_4_;
      auVar71._8_4_ = auVar51._12_4_;
      auVar71._12_4_ = auVar51._12_4_;
      auVar60 = pshuflw(auVar51,auVar71,0xe8);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar55 = packssdw(auVar55 & auVar35,(auVar60 | auVar55 & auVar35) ^ auVar8);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        plVar31[-3].waitingForPingReply = false;
      }
      auVar23._4_4_ = auVar51._0_4_;
      auVar23._0_4_ = auVar51._0_4_;
      auVar23._8_4_ = auVar51._8_4_;
      auVar23._12_4_ = auVar51._8_4_;
      auVar71 = auVar70 & auVar23 | auVar71;
      auVar60 = packssdw(auVar71,auVar71);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar55 = packssdw(auVar55,auVar60 ^ auVar9);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55._12_2_ >> 8 & 1) != 0) {
        plVar31[-2].waitingForPingReply = false;
      }
      auVar55 = (auVar52 | _DAT_00447cd0) ^ auVar28;
      auVar42._0_4_ = -(uint)(iVar54 < auVar55._0_4_);
      auVar42._4_4_ = -(uint)(iVar57 < auVar55._4_4_);
      auVar42._8_4_ = -(uint)(iVar58 < auVar55._8_4_);
      auVar42._12_4_ = -(uint)(iVar59 < auVar55._12_4_);
      auVar72._4_4_ = auVar42._0_4_;
      auVar72._0_4_ = auVar42._0_4_;
      auVar72._8_4_ = auVar42._8_4_;
      auVar72._12_4_ = auVar42._8_4_;
      auVar53._4_4_ = -(uint)(auVar55._4_4_ == iVar57);
      auVar53._12_4_ = -(uint)(auVar55._12_4_ == iVar59);
      auVar53._0_4_ = auVar53._4_4_;
      auVar53._8_4_ = auVar53._12_4_;
      auVar56._4_4_ = auVar42._4_4_;
      auVar56._0_4_ = auVar42._4_4_;
      auVar56._8_4_ = auVar42._12_4_;
      auVar56._12_4_ = auVar42._12_4_;
      auVar60 = auVar53 & auVar72 | auVar56;
      auVar55 = packssdw(auVar42,auVar60);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar55 = packssdw(auVar55 ^ auVar10,auVar55 ^ auVar10);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        plVar31[-1].waitingForPingReply = false;
      }
      auVar55 = pshufhw(auVar55,auVar72,0x84);
      auVar60 = pshufhw(auVar60,auVar53,0x84);
      in_XMM2 = auVar60 & auVar55;
      auVar55 = pshufhw(auVar55,auVar56,0x84);
      auVar43._8_4_ = 0xffffffff;
      auVar43._0_8_ = 0xffffffffffffffff;
      auVar43._12_4_ = 0xffffffff;
      auVar43 = (auVar55 | in_XMM2) ^ auVar43;
      auVar55 = packssdw(auVar43,auVar43);
      in_XMM1 = packsswb(auVar55,auVar55);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        plVar31->waitingForPingReply = false;
      }
      uVar33 = uVar33 + 0x10;
      plVar31 = plVar31 + 0x10;
    } while (((uVar32 >> 4) + 0x10 & 0xfffffffffffffff0) != uVar33);
  }
  return;
}

Assistant:

void TimeoutMonitor::reset()
{
    parentConnection.waitingForPingReply = false;
    waitingForConnection = false;
    for (auto& conn : connections) {
        conn.waitingForPingReply = false;
    }
}